

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O0

KeyboardModifiers QXkbCommon::modifiers(xkb_state *state,xkb_keysym_t keysym)

{
  bool bVar1;
  int iVar2;
  xkb_keysym_t in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  KeyboardModifiers modifiers;
  KeyboardModifier in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  QFlagsStorage<Qt::KeyboardModifier> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.i = 0xaaaaaaaa;
  QFlags<Qt::KeyboardModifier>::QFlags
            ((QFlags<Qt::KeyboardModifier> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  iVar2 = xkb_state_mod_name_is_active(in_RDI,"Control",8);
  if (0 < iVar2) {
    QFlags<Qt::KeyboardModifier>::operator|=
              ((QFlags<Qt::KeyboardModifier> *)&local_c,ControlModifier);
  }
  iVar2 = xkb_state_mod_name_is_active(in_RDI,"Mod1",8);
  if (0 < iVar2) {
    QFlags<Qt::KeyboardModifier>::operator|=((QFlags<Qt::KeyboardModifier> *)&local_c,AltModifier);
  }
  iVar2 = xkb_state_mod_name_is_active(in_RDI,"Shift",8);
  if (0 < iVar2) {
    QFlags<Qt::KeyboardModifier>::operator|=((QFlags<Qt::KeyboardModifier> *)&local_c,ShiftModifier)
    ;
  }
  iVar2 = xkb_state_mod_name_is_active(in_RDI,"Mod4",8);
  if (0 < iVar2) {
    QFlags<Qt::KeyboardModifier>::operator|=((QFlags<Qt::KeyboardModifier> *)&local_c,MetaModifier);
  }
  bVar1 = isKeypad(in_ESI);
  if (bVar1) {
    QFlags<Qt::KeyboardModifier>::operator|=
              ((QFlags<Qt::KeyboardModifier> *)&local_c,KeypadModifier);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
         (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)local_c.i;
}

Assistant:

Qt::KeyboardModifiers QXkbCommon::modifiers(struct xkb_state *state, xkb_keysym_t keysym)
{
    Qt::KeyboardModifiers modifiers = Qt::NoModifier;

    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_CTRL, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ControlModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_ALT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::AltModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_SHIFT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ShiftModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_LOGO, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::MetaModifier;

    if (isKeypad(keysym))
        modifiers |= Qt::KeypadModifier;

    return modifiers;
}